

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::average_down
          (NavierStokesBase *this,MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp)

{
  amrex::EB_average_down(S_fine,S_crse,scomp,ncomp,&(this->super_AmrLevel).fine_ratio);
  return;
}

Assistant:

void
NavierStokesBase::average_down(const MultiFab& S_fine, MultiFab& S_crse,
                               int scomp, int ncomp)
{
  //
  // Choose the appropriate AMReX average_down() based on
  // whether EB or non-EB, and dimensionality
  //

#ifdef AMREX_USE_EB
  //
  // FIXME?
  // Assume we want EB to behave the same as non-EB in regards to dimensionality
  // Note that 3D volume weighting doesn't exist for non-EB
  //
#if (AMREX_SPACEDIM == 3)
    // no volume weighting
    amrex::EB_average_down(S_fine, S_crse, scomp, ncomp, fine_ratio);
#else
    // volume weighting
    amrex::EB_average_down(S_fine, S_crse, this->getLevel(level+1).Volume(),
                           *(this->getLevel(level+1).VolFrac()),
                           scomp, ncomp, fine_ratio);
#endif

#else
    //
    // non-EB aware, uses volume weighting for 1D,2D but no volume weighting for 3D
    //
    amrex::average_down(S_fine, S_crse,
                        this->getLevel(level+1).geom, this->getLevel(level).geom,
                        scomp, ncomp, fine_ratio);
#endif
}